

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _w;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  uint uVar15;
  void *pvVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  uint uVar27;
  void *pvVar28;
  float *pfVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  int local_1b0;
  Mat gates;
  Mat cell;
  Mat hidden;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  _w = top_blob->w;
  Mat::Mat(&hidden,_w,4,opt->workspace_allocator);
  local_1b0 = -100;
  if ((hidden.data != (void *)0x0) && ((long)hidden.c * hidden.cstep != 0)) {
    Mat::Mat(&cell,_w,4,opt->workspace_allocator);
    local_1b0 = -100;
    if ((cell.data != (void *)0x0) && ((long)cell.c * cell.cstep != 0)) {
      Mat::Mat(&gates,4,_w,4,opt->workspace_allocator);
      local_1b0 = -100;
      if ((gates.data != (void *)0x0) && ((long)gates.c * gates.cstep != 0)) {
        Mat::fill(&hidden,0.0);
        Mat::fill(&cell,0.0);
        pvVar5 = bottom_blob->data;
        sVar6 = bottom_blob->elemsize;
        iVar3 = bottom_blob->w;
        pvVar7 = top_blob->data;
        sVar8 = top_blob->elemsize;
        iVar4 = top_blob->w;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        local_1b0 = 0;
        uVar20 = (ulong)_w;
        if ((int)_w < 1) {
          uVar20 = 0;
        }
        uVar15 = 0;
        if (0 < (int)uVar2) {
          uVar15 = uVar2;
        }
        for (uVar27 = 0; pvVar12 = hidden.data, pvVar11 = cell.data, uVar27 != uVar15;
            uVar27 = uVar27 + 1) {
          uVar10 = ~uVar27 + uVar2;
          if (reverse == 0) {
            uVar10 = uVar27;
          }
          lVar13 = (long)bias_c->w * bias_c->elemsize;
          pvVar9 = bias_c->data;
          pvVar25 = weight_xc->data;
          pvVar17 = weight_hc->data;
          lVar22 = (long)weight_xc->w * weight_xc->elemsize;
          lVar18 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar26 = (void *)(lVar22 * (int)(_w * 3) + (long)pvVar25);
          pvVar14 = (void *)(lVar22 * (int)(_w * 2) + (long)pvVar25);
          pvVar21 = (void *)(lVar22 * (int)_w + (long)pvVar25);
          pvVar28 = (void *)(lVar18 * (int)(_w * 3) + (long)pvVar17);
          pvVar24 = (void *)(lVar18 * (int)(_w * 2) + (long)pvVar17);
          pvVar16 = (void *)(lVar18 * (int)_w + (long)pvVar17);
          for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
            fVar33 = *(float *)((long)pvVar9 + uVar19 * 4 + lVar13 * 3);
            fVar32 = *(float *)((long)pvVar9 + uVar19 * 4 + lVar13 * 2);
            fVar31 = *(float *)((long)pvVar9 + uVar19 * 4 + lVar13);
            fVar30 = *(float *)((long)pvVar9 + uVar19 * 4);
            for (uVar23 = 0; uVar1 != uVar23; uVar23 = uVar23 + 1) {
              fVar34 = *(float *)((long)pvVar5 + uVar23 * 4 + (long)(int)(iVar3 * uVar10) * sVar6);
              fVar30 = fVar30 + fVar34 * *(float *)((long)pvVar25 + uVar23 * 4);
              fVar31 = fVar31 + fVar34 * *(float *)((long)pvVar21 + uVar23 * 4);
              fVar32 = fVar32 + fVar34 * *(float *)((long)pvVar14 + uVar23 * 4);
              fVar33 = fVar33 + fVar34 * *(float *)((long)pvVar26 + uVar23 * 4);
            }
            for (uVar23 = 0; _w != uVar23; uVar23 = uVar23 + 1) {
              if (uVar27 == 0) {
                fVar34 = 0.0;
              }
              else {
                fVar34 = *(float *)((long)hidden.data + uVar23 * 4);
              }
              fVar30 = fVar30 + fVar34 * *(float *)((long)pvVar17 + uVar23 * 4);
              fVar31 = fVar31 + fVar34 * *(float *)((long)pvVar16 + uVar23 * 4);
              fVar32 = fVar32 + fVar34 * *(float *)((long)pvVar24 + uVar23 * 4);
              fVar33 = fVar33 + fVar34 * *(float *)((long)pvVar28 + uVar23 * 4);
            }
            pfVar29 = (float *)((long)gates.data + uVar19 * (long)gates.w * gates.elemsize);
            *pfVar29 = fVar30;
            pfVar29[1] = fVar31;
            pfVar29[2] = fVar32;
            pfVar29[3] = fVar33;
            pvVar26 = (void *)((long)pvVar26 + lVar22);
            pvVar14 = (void *)((long)pvVar14 + lVar22);
            pvVar21 = (void *)((long)pvVar21 + lVar22);
            pvVar25 = (void *)((long)pvVar25 + lVar22);
            pvVar28 = (void *)((long)pvVar28 + lVar18);
            pvVar24 = (void *)((long)pvVar24 + lVar18);
            pvVar16 = (void *)((long)pvVar16 + lVar18);
            pvVar17 = (void *)((long)pvVar17 + lVar18);
          }
          lVar13 = (long)gates.w * gates.elemsize;
          pfVar29 = (float *)((long)gates.data + 0xc);
          for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
            fVar31 = expf(-pfVar29[-3]);
            fVar33 = pfVar29[-1];
            fVar32 = *pfVar29;
            if (uVar27 == 0) {
              fVar30 = 0.0;
            }
            else {
              fVar30 = expf(-pfVar29[-2]);
              fVar30 = 1.0 / (fVar30 + 1.0);
            }
            fVar33 = expf(-fVar33);
            fVar32 = tanhf(fVar32);
            fVar32 = fVar32 / (fVar31 + 1.0) + fVar30 * *(float *)((long)pvVar11 + uVar19 * 4);
            fVar31 = tanhf(fVar32);
            fVar31 = fVar31 / (fVar33 + 1.0);
            *(float *)((long)pvVar11 + uVar19 * 4) = fVar32;
            *(float *)((long)pvVar12 + uVar19 * 4) = fVar31;
            *(float *)((long)pvVar7 + uVar19 * 4 + (long)(int)(uVar10 * iVar4) * sVar8) = fVar31;
            pfVar29 = (float *)((long)pfVar29 + lVar13);
          }
        }
      }
      Mat::~Mat(&gates);
    }
    Mat::~Mat(&cell);
  }
  Mat::~Mat(&hidden);
  return local_1b0;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;

    // internal cell state
    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    hidden.fill(0.f);
    cell.fill(0.f);

    // unroll
    for (int t=0; t<T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c
        int cont = t > 0;

        int ti = reverse ? T-1-t : t;

        const float* x = bottom_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i=0; i<size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i=0; i<num_output; i++)
            {
                float h_cont = cont ? hidden[i] : 0.f;

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = cont ? 1.f / (1.f + exp(-F)) : 0.f;
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell[q] + I * G;
            float H = O * tanh(cell2);
            cell[q] = cell2;
            hidden[q] = H;
            output_data[q] = H;
        }

        // no cell output here
    }

    return 0;
}